

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  size_t deflatesize;
  uchar *deflatedata;
  size_t local_40;
  uchar *local_38;
  
  local_38 = (uchar *)0x0;
  local_40 = 0;
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_deflate(&local_38,&local_40,in,insize,settings);
  }
  else {
    uVar1 = (*settings->custom_deflate)(&local_38,&local_40,in,insize,settings);
  }
  *out = (uchar *)0x0;
  *outsize = 0;
  if (uVar1 == 0) {
    *outsize = local_40 + 6;
    puVar3 = (uchar *)malloc(local_40 + 6);
    *out = puVar3;
    uVar1 = 0;
    if (puVar3 == (uchar *)0x0) {
      uVar1 = 0x53;
    }
  }
  if (uVar1 == 0) {
    if ((int)insize == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = 1;
      uVar2 = 0;
      do {
        uVar9 = (uint)insize;
        uVar6 = 0x15b0;
        if (uVar9 < 0x15b0) {
          uVar6 = uVar9;
        }
        uVar7 = uVar9;
        if (0x15af < (insize & 0xffffffff)) {
          uVar7 = 0x15b0;
        }
        lVar8 = 0;
        do {
          uVar4 = uVar4 + in[lVar8];
          uVar2 = uVar2 + uVar4;
          lVar8 = lVar8 + 1;
        } while (uVar7 != (uint)lVar8);
        uVar4 = uVar4 % 0xfff1;
        uVar2 = uVar2 % 0xfff1;
        in = in + (ulong)(uVar6 - 1) + 1;
        insize = (size_t)(uVar9 - uVar6);
      } while (uVar9 - uVar6 != 0);
      uVar4 = uVar2 << 0x10 | uVar4;
    }
    **out = 'x';
    (*out)[1] = '\x01';
    if (local_40 != 0) {
      sVar5 = 0;
      do {
        (*out)[sVar5 + 2] = local_38[sVar5];
        sVar5 = sVar5 + 1;
      } while (sVar5 != local_40);
    }
    *(uint *)(*out + (*outsize - 4)) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  free(local_38);
  return uVar1;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings) {
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  *out = NULL;
  *outsize = 0;
  if(!error) {
    *outsize = deflatesize + 6;
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!*out) error = 83; /*alloc fail*/
  }

  if(!error) {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
    unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
    unsigned FLEVEL = 0;
    unsigned FDICT = 0;
    unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
    unsigned FCHECK = 31 - CMFFLG % 31;
    CMFFLG += FCHECK;

    (*out)[0] = (unsigned char)(CMFFLG >> 8);
    (*out)[1] = (unsigned char)(CMFFLG & 255);
    for(i = 0; i != deflatesize; ++i) (*out)[i + 2] = deflatedata[i];
    lodepng_set32bitInt(&(*out)[*outsize - 4], ADLER32);
  }

  lodepng_free(deflatedata);
  return error;
}